

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigs.c
# Opt level: O0

void print_result(int sock,int rv,cmdCmd_t cmd)

{
  uint uVar1;
  char *pcVar2;
  ushort **ppuVar3;
  long in_RCX;
  undefined4 in_ESI;
  uint32_t *p;
  int ch;
  int r;
  int i;
  int local_1c;
  uint uStack_4;
  
  uStack_4 = (uint)((ulong)in_RCX >> 0x20);
  switch(in_ESI) {
  case 0:
  case 1:
    if (in_RCX < 0) {
      printf("%d\n",(ulong)uStack_4);
      pcVar2 = cmdErrStr(uStack_4);
      report(0xfd,"ERROR: %s",pcVar2);
    }
    break;
  case 2:
    printf("%d\n",(ulong)uStack_4);
    if (in_RCX < 0) {
      pcVar2 = cmdErrStr(uStack_4);
      report(0xfd,"ERROR: %s",pcVar2);
    }
    break;
  case 3:
    printf("%08X\n",(ulong)uStack_4);
    break;
  case 4:
    printf("%u\n",(ulong)uStack_4);
    break;
  case 5:
    printf("%s",cmdUsage);
    break;
  case 6:
    printf("%d",(ulong)uStack_4);
    if (in_RCX < 0) {
      pcVar2 = cmdErrStr(uStack_4);
      report(0xfd,"ERROR: %s",pcVar2);
    }
    if (0 < (int)uStack_4) {
      if (printFlags == 2) {
        printf(" ");
      }
      for (local_1c = 0; local_1c < (int)uStack_4; local_1c = local_1c + 1) {
        uVar1 = (uint)response_buf[local_1c];
        if ((printFlags & 1U) == 0) {
          if ((printFlags & 2U) == 0) {
            printf(" %hhu",(ulong)(uint)(int)response_buf[local_1c]);
          }
          else {
            ppuVar3 = __ctype_b_loc();
            if (((((*ppuVar3)[(int)uVar1] & 0x4000) == 0) && (uVar1 != 10)) && (uVar1 != 0xd)) {
              printf("\\x%02hhx",(ulong)uVar1);
            }
            else {
              printf("%c",(ulong)uVar1);
            }
          }
        }
        else {
          printf(" %hhx",(ulong)uVar1);
        }
      }
    }
    printf("\n");
    break;
  case 7:
    if (uStack_4 == 0x2c) {
      printf("%d",(ulong)(uint)response_buf._0_4_);
      for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
        printf(" %d",(ulong)*(uint *)(response_buf + (long)(local_1c + 1) * 4));
      }
    }
    else {
      printf("%d",(ulong)uStack_4);
      pcVar2 = cmdErrStr(uStack_4);
      report(0xfd,"ERROR: %s",pcVar2);
    }
    printf("\n");
    break;
  case 8:
    if (in_RCX < 0) {
      printf("%d\n",(ulong)uStack_4);
      pcVar2 = cmdErrStr(uStack_4);
      report(0xfd,"ERROR: %s",pcVar2);
    }
    else {
      printf("%d %d",(ulong)(uStack_4 - 3),(ulong)(uint)response_buf._0_4_);
      if (4 < (int)uStack_4) {
        if (printFlags == 2) {
          printf(" ");
        }
        for (local_1c = 4; local_1c < (int)uStack_4; local_1c = local_1c + 1) {
          uVar1 = (uint)response_buf[local_1c];
          if ((printFlags & 1U) == 0) {
            if ((printFlags & 2U) == 0) {
              printf(" %hhu",(ulong)(uint)(int)response_buf[local_1c]);
            }
            else {
              ppuVar3 = __ctype_b_loc();
              if (((((*ppuVar3)[(int)uVar1] & 0x4000) == 0) && (uVar1 != 10)) && (uVar1 != 0xd)) {
                printf("\\x%02hhx",(ulong)uVar1);
              }
              else {
                printf("%c",(ulong)uVar1);
              }
            }
          }
          else {
            printf(" %hhx",(ulong)uVar1);
          }
        }
      }
      printf("\n");
    }
  }
  return;
}

Assistant:

void print_result(int sock, int rv, cmdCmd_t cmd)
{
   int i, r, ch;
   uint32_t *p;

   r = cmd.res;

   switch (rv)
   {
      case 0:
      case 1:
         if (r < 0)
         {
            printf("%d\n", r);
            report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         }
         break;

      case 2:
         printf("%d\n", r);
         if (r < 0) report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         break;

      case 3:
         printf("%08X\n", cmd.res);
         break;

      case 4:
         printf("%u\n", cmd.res);
         break;

      case 5:
         printf("%s", cmdUsage);
         break;

      case 6: /*
                 BI2CZ  CF2  FL  FR  I2CPK  I2CRD  I2CRI  I2CRK
                 I2CZ  SERR  SLR  SPIX  SPIR
              */
         printf("%d", r);
         if (r < 0) report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         if (r > 0)
         {
            if (printFlags == PRINT_ASCII) printf(" ");

            for (i=0; i<r; i++)
            {
               ch = response_buf[i];

               if (printFlags & PRINT_HEX) printf(" %hhx", ch);

               else if (printFlags & PRINT_ASCII)
               {
                  if (isprint(ch) || (ch == '\n') || (ch == '\r'))
                     printf("%c", ch);
                  else printf("\\x%02hhx", ch);
               }
               else printf(" %hhu", response_buf[i]);
            }
         }
         printf("\n");
         break;

      case 7: /* PROCP */
         if (r != (4 + (4*PI_MAX_SCRIPT_PARAMS)))
         {
            printf("%d", r);
            report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         }
         else
         {
            p = (uint32_t *)response_buf;
            printf("%d", p[0]);
            for (i=0; i<PI_MAX_SCRIPT_PARAMS; i++)
            {
               printf(" %d", p[i+1]);
            }
         }
         printf("\n");
         break;

      case 8: /*
                 BSCX
              */
         if (r < 0)
         {
            printf("%d\n", r);
            report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
            break;
         }

         p = (uint32_t *)response_buf;
         printf("%d %d", r-3, p[0]);

         if (r > 4)
         {
            if (printFlags == PRINT_ASCII) printf(" ");

            for (i=4; i<r; i++)
            {
               ch = response_buf[i];

               if (printFlags & PRINT_HEX) printf(" %hhx", ch);

               else if (printFlags & PRINT_ASCII)
               {
                  if (isprint(ch) || (ch == '\n') || (ch == '\r'))
                     printf("%c", ch);
                  else printf("\\x%02hhx", ch);
               }
               else printf(" %hhu", response_buf[i]);
            }
         }
         printf("\n");
         break;

   }
}